

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

int __thiscall
adios2::helper::CommImplMPI::Win_unlock(CommImplMPI *this,int rank,Win *win,string *hint)

{
  int iVar1;
  long lVar2;
  Win *in_RDX;
  undefined4 in_ESI;
  int ret;
  CommWinImplMPI *w;
  string *in_stack_000000b8;
  int in_stack_000000c4;
  undefined4 in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long local_90;
  string local_70 [16];
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  string local_50 [36];
  int local_2c;
  long local_28;
  undefined4 local_c;
  
  local_c = in_ESI;
  lVar2 = adios2::helper::CommWinImpl::Get(in_RDX);
  if (lVar2 == 0) {
    local_90 = 0;
  }
  else {
    local_90 = __dynamic_cast(lVar2,&CommWinImpl::typeinfo,&CommWinImplMPI::typeinfo,0);
  }
  local_28 = local_90;
  iVar1 = MPI_Win_unlock(local_c,*(undefined8 *)(local_90 + 8));
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
  local_2c = iVar1;
  std::operator+((char *)in_stack_ffffffffffffffa8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffa0);
  std::operator+(__lhs,(char *)CONCAT44(iVar1,in_stack_ffffffffffffff60));
  anon_unknown_1::CheckMPIReturn(in_stack_000000c4,in_stack_000000b8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return local_2c;
}

Assistant:

int CommImplMPI::Win_unlock(int rank, Comm::Win &win, const std::string &hint) const
{
    CommWinImplMPI *w = dynamic_cast<CommWinImplMPI *>(CommWinImpl::Get(win));
    int ret = MPI_Win_unlock(rank, w->m_Win);
    CheckMPIReturn(ret, "in call to Win_Lock " + hint + "\n");
    return ret;
}